

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O0

bool __thiscall
cmFindBase::ParseArguments
          (cmFindBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn)

{
  cmMakefile *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  char *env;
  reference pvVar4;
  View *pVVar5;
  cmState *this_01;
  string *psVar6;
  ulong uVar7;
  iterator last;
  string_view name;
  undefined1 auVar8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_470;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_390;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_388;
  undefined1 local_380 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  shortArgs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  string_view local_328;
  string_view local_318;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_308;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_2f8;
  string local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  char local_281;
  string local_280;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_260;
  pointer local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_248;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_240;
  undefined1 local_232;
  allocator<char> local_231;
  string local_230;
  cmValue local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  iterator local_1e0;
  size_type local_1d8;
  undefined1 local_1d0 [8];
  cmList macros;
  value_type *validatorName;
  string local_1a8;
  undefined1 local_188 [8];
  Command command;
  string local_160;
  string local_140;
  undefined1 local_120 [16];
  _Optional_payload_base<cmWindowsRegistry::View> local_10c;
  optional<cmWindowsRegistry::View> view;
  allocator<char> local_d9;
  string local_d8;
  uint local_b4;
  int local_b0;
  uint j_1;
  Doing doing;
  bool newStyle;
  string local_a0;
  uint local_80;
  byte local_79;
  uint j;
  bool foundDoc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  size_t size;
  allocator<char> local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *argsIn_local;
  cmFindBase *this_local;
  
  local_20 = argsIn;
  argsIn_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(argsIn);
  if (sVar2 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmFindCommon::SetError(&this->super_cmFindCommon,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = 0;
  }
  else {
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(local_20);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&j);
    local_79 = 0;
    for (local_80 = 0;
        (pointer)(ulong)local_80 <
        args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage; local_80 = local_80 + 1) {
      if ((local_79 & 1) == 0) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_20,(ulong)local_80);
        bVar1 = std::operator!=(pvVar3,"DOC");
        if (bVar1) goto LAB_00a0ac42;
        if ((pointer)(ulong)(local_80 + 1) <
            args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_79 = 1;
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_20,(ulong)(local_80 + 1));
          std::__cxx11::string::operator=((string *)&this->VariableDocumentation,(string *)pvVar3);
          local_80 = local_80 + 1;
          if (args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage <= (pointer)(ulong)local_80) break;
        }
      }
      else {
LAB_00a0ac42:
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_20,(ulong)local_80);
        bVar1 = std::operator==(pvVar3,"NO_CACHE");
        if (bVar1) {
          this->StoreResultInCache = false;
        }
        else {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_20,(ulong)local_80);
          bVar1 = std::operator==(pvVar3,"ENV");
          if (bVar1) {
            if ((pointer)(ulong)(local_80 + 1) <
                args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_80 = local_80 + 1;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](local_20,(ulong)local_80);
              env = (char *)std::__cxx11::string::c_str();
              cmsys::SystemTools::GetPath
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&j,env);
            }
          }
          else {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](local_20,(ulong)local_80);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&j,pvVar3);
          }
        }
      }
    }
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&j);
    if (sVar2 < 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"called with incorrect number of arguments",
                 (allocator<char> *)&newStyle);
      cmFindCommon::SetError(&this->super_cmFindCommon,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&newStyle);
      this_local._7_1_ = 0;
      doing = DoingNames;
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&j,0);
      std::__cxx11::string::operator=((string *)&this->VariableName,(string *)pvVar4);
      bVar1 = CheckForVariableDefined(this);
      if (bVar1) {
        this->AlreadyDefined = true;
        this_local._7_1_ = 1;
        doing = DoingNames;
      }
      else {
        cmFindCommon::SelectDefaultSearchModes(&this->super_cmFindCommon);
        cmFindCommon::SelectDefaultRootPathMode(&this->super_cmFindCommon);
        cmFindCommon::SelectDefaultMacMode(&this->super_cmFindCommon);
        j_1._3_1_ = 0;
        local_b0 = 1;
        local_b4 = 1;
        while( true ) {
          uVar7 = (ulong)local_b4;
          sVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&j);
          if (sVar2 <= uVar7) break;
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&j,(ulong)local_b4);
          bVar1 = std::operator==(pvVar4,"NAMES");
          if (bVar1) {
            local_b0 = 1;
            j_1._3_1_ = 1;
          }
          else {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&j,(ulong)local_b4);
            bVar1 = std::operator==(pvVar4,"PATHS");
            if (bVar1) {
              local_b0 = 2;
              j_1._3_1_ = 1;
            }
            else {
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&j,(ulong)local_b4);
              bVar1 = std::operator==(pvVar4,"HINTS");
              if (bVar1) {
                local_b0 = 4;
                j_1._3_1_ = 1;
              }
              else {
                pvVar4 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&j,(ulong)local_b4);
                bVar1 = std::operator==(pvVar4,"PATH_SUFFIXES");
                if (bVar1) {
                  local_b0 = 3;
                  j_1._3_1_ = 1;
                }
                else {
                  pvVar4 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&j,(ulong)local_b4);
                  bVar1 = std::operator==(pvVar4,"NAMES_PER_DIR");
                  if (bVar1) {
                    local_b0 = 0;
                    if ((this->NamesPerDirAllowed & 1U) == 0) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_d8,"does not support NAMES_PER_DIR",&local_d9);
                      cmFindCommon::SetError(&this->super_cmFindCommon,&local_d8);
                      std::__cxx11::string::~string((string *)&local_d8);
                      std::allocator<char>::~allocator(&local_d9);
                      this_local._7_1_ = 0;
                      doing = DoingNames;
                      goto LAB_00a0c087;
                    }
                    this->NamesPerDir = true;
                  }
                  else {
                    pvVar4 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&j,(ulong)local_b4);
                    bVar1 = std::operator==(pvVar4,"NO_SYSTEM_PATH");
                    if (bVar1) {
                      local_b0 = 0;
                      (this->super_cmFindCommon).NoDefaultPath = true;
                    }
                    else {
                      pvVar4 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&j,(ulong)local_b4);
                      bVar1 = std::operator==(pvVar4,"REQUIRED");
                      if (bVar1) {
                        local_b0 = 0;
                        this->Required = true;
                        j_1._3_1_ = 1;
                      }
                      else {
                        pvVar4 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)&j,(ulong)local_b4);
                        bVar1 = std::operator==(pvVar4,"REGISTRY_VIEW");
                        if (bVar1) {
                          local_b4 = local_b4 + 1;
                          uVar7 = (ulong)local_b4;
                          sVar2 = std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)&j);
                          if (uVar7 == sVar2) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)
                                       &view.
                                        super__Optional_base<cmWindowsRegistry::View,_true,_true>.
                                        _M_payload.
                                        super__Optional_payload_base<cmWindowsRegistry::View>.
                                        _M_engaged,"missing required argument for \"REGISTRY_VIEW\""
                                       ,(allocator<char> *)
                                        ((long)&view.
                                                super__Optional_base<cmWindowsRegistry::View,_true,_true>
                                                ._M_payload.
                                                super__Optional_payload_base<cmWindowsRegistry::View>
                                                ._M_payload._M_value + 3));
                            cmFindCommon::SetError
                                      (&this->super_cmFindCommon,
                                       (string *)
                                       &view.
                                        super__Optional_base<cmWindowsRegistry::View,_true,_true>.
                                        _M_payload.
                                        super__Optional_payload_base<cmWindowsRegistry::View>.
                                        _M_engaged);
                            std::__cxx11::string::~string
                                      ((string *)
                                       &view.
                                        super__Optional_base<cmWindowsRegistry::View,_true,_true>.
                                        _M_payload.
                                        super__Optional_payload_base<cmWindowsRegistry::View>.
                                        _M_engaged);
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)
                                       ((long)&view.
                                               super__Optional_base<cmWindowsRegistry::View,_true,_true>
                                               ._M_payload.
                                               super__Optional_payload_base<cmWindowsRegistry::View>
                                               ._M_payload._M_value + 3));
                            this_local._7_1_ = 0;
                            doing = DoingNames;
                            goto LAB_00a0c087;
                          }
                          pvVar4 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)&j,(ulong)local_b4);
                          auVar8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                             ((string *)pvVar4);
                          name._M_str = auVar8._8_8_;
                          name._M_len = (size_t)name._M_str;
                          local_120 = auVar8;
                          local_10c = (_Optional_payload_base<cmWindowsRegistry::View>)
                                      cmWindowsRegistry::ToView(auVar8._0_8_,name);
                          bVar1 = std::optional::operator_cast_to_bool((optional *)&local_10c);
                          if (!bVar1) {
                            pvVar4 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&j,(ulong)local_b4);
                            cmStrCat<char_const(&)[42],std::__cxx11::string&>
                                      (&local_140,
                                       (char (*) [42])"given invalid value for \"REGISTRY_VIEW\": ",
                                       pvVar4);
                            cmFindCommon::SetError(&this->super_cmFindCommon,&local_140);
                            std::__cxx11::string::~string((string *)&local_140);
                            this_local._7_1_ = 0;
                            doing = DoingNames;
                            goto LAB_00a0c087;
                          }
                          pVVar5 = std::optional<cmWindowsRegistry::View>::operator*
                                             ((optional<cmWindowsRegistry::View> *)&local_10c);
                          (this->super_cmFindCommon).RegistryView = *pVVar5;
                        }
                        else {
                          pvVar4 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)&j,(ulong)local_b4);
                          bVar1 = std::operator==(pvVar4,"VALIDATOR");
                          if (bVar1) {
                            local_b4 = local_b4 + 1;
                            uVar7 = (ulong)local_b4;
                            sVar2 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)&j);
                            if (uVar7 == sVar2) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_160,
                                         "missing required argument for \"VALIDATOR\"",
                                         (allocator<char> *)((long)&command._M_invoker + 7));
                              cmFindCommon::SetError(&this->super_cmFindCommon,&local_160);
                              std::__cxx11::string::~string((string *)&local_160);
                              std::allocator<char>::~allocator
                                        ((allocator<char> *)((long)&command._M_invoker + 7));
                              this_local._7_1_ = 0;
                              doing = DoingNames;
                              goto LAB_00a0c087;
                            }
                            this_01 = cmMakefile::GetState((this->super_cmFindCommon).Makefile);
                            pvVar4 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&j,(ulong)local_b4);
                            cmState::GetCommand((Command *)local_188,this_01,pvVar4);
                            bVar1 = std::operator==((
                                                  function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
                                                  *)local_188,(nullptr_t)0x0);
                            if (bVar1) {
                              pvVar4 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&j,(ulong)local_b4);
                              validatorName._7_1_ = 0x2e;
                              cmStrCat<char_const(&)[49],std::__cxx11::string&,char>
                                        (&local_1a8,
                                         (char (*) [49])
                                         "command specified for \"VALIDATOR\" is undefined: ",pvVar4
                                         ,(char *)((long)&validatorName + 7));
                              cmFindCommon::SetError(&this->super_cmFindCommon,&local_1a8);
                              std::__cxx11::string::~string((string *)&local_1a8);
                              this_local._7_1_ = 0;
                              doing = DoingNames;
                            }
                            else {
                              macros.Values.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                   std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)&j,(ulong)local_b4);
                              local_232 = 1;
                              local_208 = &local_200;
                              this_00 = (this->super_cmFindCommon).Makefile;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_230,"MACROS",&local_231);
                              local_210 = cmMakefile::GetProperty(this_00,&local_230);
                              psVar6 = cmValue::operator_cast_to_string_(&local_210);
                              std::__cxx11::string::string((string *)&local_200,(string *)psVar6);
                              local_232 = 0;
                              local_1e0 = &local_200;
                              local_1d8 = 1;
                              init._M_len = 1;
                              init._M_array = local_1e0;
                              cmList::cmList((cmList *)local_1d0,init);
                              local_470 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&local_1e0;
                              do {
                                local_470 = local_470 + -1;
                                std::__cxx11::string::~string((string *)local_470);
                              } while (local_470 != &local_200);
                              std::__cxx11::string::~string((string *)&local_230);
                              std::allocator<char>::~allocator(&local_231);
                              local_248._M_current =
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)cmList::begin_abi_cxx11_((cmList *)local_1d0);
                              local_250 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)cmList::end_abi_cxx11_((cmList *)local_1d0);
                              local_258 = macros.Values.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
                              local_240 = std::
                                          find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmFindBase::ParseArguments(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                                                    (local_248,
                                                     (
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )local_250,
                                                  (anon_class_8_1_d1845f1d_for__M_pred)
                                                  macros.Values.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                              local_260._M_current =
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)cmList::end_abi_cxx11_((cmList *)local_1d0);
                              bVar1 = __gnu_cxx::operator!=(&local_240,&local_260);
                              if (bVar1) {
                                pvVar4 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&j,(ulong)local_b4);
                                local_281 = '.';
                                cmStrCat<char_const(&)[54],std::__cxx11::string&,char>
                                          (&local_280,
                                           (char (*) [54])
                                           "command specified for \"VALIDATOR\" is not a function: "
                                           ,pvVar4,&local_281);
                                cmFindCommon::SetError(&this->super_cmFindCommon,&local_280);
                                std::__cxx11::string::~string((string *)&local_280);
                                this_local._7_1_ = 0;
                              }
                              else {
                                pvVar4 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&j,(ulong)local_b4);
                                std::__cxx11::string::operator=
                                          ((string *)&this->ValidatorName,(string *)pvVar4);
                              }
                              doing = (Doing)bVar1;
                              cmList::~cmList((cmList *)local_1d0);
                            }
                            std::
                            function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
                            ::~function((function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
                                         *)local_188);
                            if (doing != DoingNone) goto LAB_00a0c087;
                          }
                          else {
                            pvVar4 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&j,(ulong)local_b4);
                            bVar1 = cmFindCommon::CheckCommonArgument
                                              (&this->super_cmFindCommon,pvVar4);
                            if (bVar1) {
                              local_b0 = 0;
                            }
                            else if (local_b0 == 1) {
                              pvVar4 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&j,(ulong)local_b4);
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::push_back(&this->Names,pvVar4);
                            }
                            else if (local_b0 == 2) {
                              pvVar4 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&j,(ulong)local_b4);
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::push_back(&(this->super_cmFindCommon).UserGuessArgs,pvVar4);
                            }
                            else if (local_b0 == 4) {
                              pvVar4 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&j,(ulong)local_b4);
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::push_back(&(this->super_cmFindCommon).UserHintsArgs,pvVar4);
                            }
                            else if (local_b0 == 3) {
                              pvVar4 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&j,(ulong)local_b4);
                              cmFindCommon::AddPathSuffix(&this->super_cmFindCommon,pvVar4);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          local_b4 = local_b4 + 1;
        }
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) != 0) {
          std::__cxx11::string::operator=((string *)&this->VariableDocumentation,"Where can ");
          bVar1 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty(&this->Names);
          if (bVar1) {
            std::__cxx11::string::operator+=
                      ((string *)&this->VariableDocumentation,"the (unknown) library be found");
          }
          else {
            sVar2 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&this->Names);
            if (sVar2 == 1) {
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::front(&this->Names);
              std::operator+(&local_2c8,"the ",pvVar4);
              std::operator+(&local_2a8,&local_2c8," library be found");
              std::__cxx11::string::operator+=
                        ((string *)&this->VariableDocumentation,(string *)&local_2a8);
              std::__cxx11::string::~string((string *)&local_2a8);
              std::__cxx11::string::~string((string *)&local_2c8);
            }
            else {
              std::__cxx11::string::operator+=((string *)&this->VariableDocumentation,"one of the ")
              ;
              local_308 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    (&this->Names);
              local_2f8 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ::retreat(&local_308,1);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_318,", ");
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_328);
              cmJoin(&local_2e8,&local_2f8,local_318,local_328);
              std::__cxx11::string::operator+=
                        ((string *)&this->VariableDocumentation,(string *)&local_2e8);
              std::__cxx11::string::~string((string *)&local_2e8);
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::back(&this->Names);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &shortArgs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage," or ",pvVar4);
              std::operator+(&local_348,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &shortArgs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             " libraries be found");
              std::__cxx11::string::operator+=
                        ((string *)&this->VariableDocumentation,(string *)&local_348);
              std::__cxx11::string::~string((string *)&local_348);
              std::__cxx11::string::~string
                        ((string *)
                         &shortArgs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
          }
        }
        if ((j_1._3_1_ & 1) == 0) {
          bVar1 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty(&this->Names);
          if (!bVar1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_380,&this->Names);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear(&this->Names);
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_380,0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->Names,pvVar4);
            local_390._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_380);
            local_388 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator+(&local_390,1);
            last = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_380);
            ::cm::
            append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                      (&(this->super_cmFindCommon).UserGuessArgs,local_388,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )last._M_current);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_380);
          }
        }
        ExpandPaths(this);
        cmFindCommon::ComputeFinalPaths(&this->super_cmFindCommon,Yes);
        this_local._7_1_ = 1;
        doing = DoingNames;
      }
    }
LAB_00a0c087:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&j);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFindBase::ParseArguments(std::vector<std::string> const& argsIn)
{
  if (argsIn.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // copy argsIn into args so it can be modified,
  // in the process extract the DOC "documentation"
  // and handle options NO_CACHE and ENV
  size_t size = argsIn.size();
  std::vector<std::string> args;
  bool foundDoc = false;
  for (unsigned int j = 0; j < size; ++j) {
    if (foundDoc || argsIn[j] != "DOC") {
      if (argsIn[j] == "NO_CACHE") {
        this->StoreResultInCache = false;
      } else if (argsIn[j] == "ENV") {
        if (j + 1 < size) {
          j++;
          cmSystemTools::GetPath(args, argsIn[j].c_str());
        }
      } else {
        args.push_back(argsIn[j]);
      }
    } else {
      if (j + 1 < size) {
        foundDoc = true;
        this->VariableDocumentation = argsIn[j + 1];
        j++;
        if (j >= size) {
          break;
        }
      }
    }
  }
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  this->VariableName = args[0];
  if (this->CheckForVariableDefined()) {
    this->AlreadyDefined = true;
    return true;
  }

  // Find what search path locations have been enabled/disable
  this->SelectDefaultSearchModes();

  // Find the current root path mode.
  this->SelectDefaultRootPathMode();

  // Find the current bundle/framework search policy.
  this->SelectDefaultMacMode();

  bool newStyle = false;
  enum Doing
  {
    DoingNone,
    DoingNames,
    DoingPaths,
    DoingPathSuffixes,
    DoingHints
  };
  Doing doing = DoingNames; // assume it starts with a name
  for (unsigned int j = 1; j < args.size(); ++j) {
    if (args[j] == "NAMES") {
      doing = DoingNames;
      newStyle = true;
    } else if (args[j] == "PATHS") {
      doing = DoingPaths;
      newStyle = true;
    } else if (args[j] == "HINTS") {
      doing = DoingHints;
      newStyle = true;
    } else if (args[j] == "PATH_SUFFIXES") {
      doing = DoingPathSuffixes;
      newStyle = true;
    } else if (args[j] == "NAMES_PER_DIR") {
      doing = DoingNone;
      if (this->NamesPerDirAllowed) {
        this->NamesPerDir = true;
      } else {
        this->SetError("does not support NAMES_PER_DIR");
        return false;
      }
    } else if (args[j] == "NO_SYSTEM_PATH") {
      doing = DoingNone;
      this->NoDefaultPath = true;
    } else if (args[j] == "REQUIRED") {
      doing = DoingNone;
      this->Required = true;
      newStyle = true;
    } else if (args[j] == "REGISTRY_VIEW") {
      if (++j == args.size()) {
        this->SetError("missing required argument for \"REGISTRY_VIEW\"");
        return false;
      }
      auto view = cmWindowsRegistry::ToView(args[j]);
      if (view) {
        this->RegistryView = *view;
      } else {
        this->SetError(
          cmStrCat("given invalid value for \"REGISTRY_VIEW\": ", args[j]));
        return false;
      }
    } else if (args[j] == "VALIDATOR") {
      if (++j == args.size()) {
        this->SetError("missing required argument for \"VALIDATOR\"");
        return false;
      }
      auto command = this->Makefile->GetState()->GetCommand(args[j]);
      if (command == nullptr) {
        this->SetError(cmStrCat(
          "command specified for \"VALIDATOR\" is undefined: ", args[j], '.'));
        return false;
      }
      // ensure a macro is not specified as validator
      const auto& validatorName = args[j];
      cmList macros{ this->Makefile->GetProperty("MACROS") };
      if (std::find_if(macros.begin(), macros.end(),
                       [&validatorName](const std::string& item) {
                         return cmSystemTools::Strucmp(validatorName.c_str(),
                                                       item.c_str()) == 0;
                       }) != macros.end()) {
        this->SetError(cmStrCat(
          "command specified for \"VALIDATOR\" is not a function: ", args[j],
          '.'));
        return false;
      }
      this->ValidatorName = args[j];
    } else if (this->CheckCommonArgument(args[j])) {
      doing = DoingNone;
    } else {
      // Some common arguments were accidentally supported by CMake
      // 2.4 and 2.6.0 in the short-hand form of the command, so we
      // must support it even though it is not documented.
      if (doing == DoingNames) {
        this->Names.push_back(args[j]);
      } else if (doing == DoingPaths) {
        this->UserGuessArgs.push_back(args[j]);
      } else if (doing == DoingHints) {
        this->UserHintsArgs.push_back(args[j]);
      } else if (doing == DoingPathSuffixes) {
        this->AddPathSuffix(args[j]);
      }
    }
  }

  if (this->VariableDocumentation.empty()) {
    this->VariableDocumentation = "Where can ";
    if (this->Names.empty()) {
      this->VariableDocumentation += "the (unknown) library be found";
    } else if (this->Names.size() == 1) {
      this->VariableDocumentation +=
        "the " + this->Names.front() + " library be found";
    } else {
      this->VariableDocumentation += "one of the ";
      this->VariableDocumentation +=
        cmJoin(cmMakeRange(this->Names).retreat(1), ", ");
      this->VariableDocumentation +=
        " or " + this->Names.back() + " libraries be found";
    }
  }

  // look for old style
  // FIND_*(VAR name path1 path2 ...)
  if (!newStyle && !this->Names.empty()) {
    // All the short-hand arguments have been recorded as names.
    std::vector<std::string> shortArgs = this->Names;
    this->Names.clear(); // clear out any values in Names
    this->Names.push_back(shortArgs[0]);
    cm::append(this->UserGuessArgs, shortArgs.begin() + 1, shortArgs.end());
  }
  this->ExpandPaths();

  this->ComputeFinalPaths(IgnorePaths::Yes);

  return true;
}